

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O2

void Kit_SopDivideByLiteralQuo(Kit_Sop_t *cSop,int iLit)

{
  uint uVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  bVar2 = (byte)iLit & 0x1f;
  iVar4 = 0;
  for (lVar3 = 0; lVar3 < cSop->nCubes; lVar3 = lVar3 + 1) {
    uVar1 = cSop->pCubes[lVar3];
    if (uVar1 == 0) break;
    if ((uVar1 & 1 << ((byte)iLit & 0x1f)) != 0) {
      lVar5 = (long)iVar4;
      iVar4 = iVar4 + 1;
      cSop->pCubes[lVar5] = uVar1 & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
    }
  }
  cSop->nCubes = iVar4;
  return;
}

Assistant:

void Kit_SopDivideByLiteralQuo( Kit_Sop_t * cSop, int iLit )
{
    unsigned uCube;
    int i, k = 0;
    Kit_SopForEachCube( cSop, uCube, i )
    {
        if ( Kit_CubeHasLit(uCube, iLit) )
            Kit_SopWriteCube( cSop, Kit_CubeRemLit(uCube, iLit), k++ );
    }
    Kit_SopShrink( cSop, k );
}